

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# device.cpp
# Opt level: O3

void embree::Device::setThreadErrorCode(RTCError error,string *msg)

{
  int iVar1;
  RTCErrorMessage *pRVar2;
  
  pRVar2 = State::ErrorHandler::error((ErrorHandler *)State::g_errorHandler);
  if (pRVar2->error == RTC_ERROR_NONE) {
    pRVar2->error = error;
    iVar1 = std::__cxx11::string::compare((char *)msg);
    if (iVar1 != 0) {
      std::__cxx11::string::_M_assign((string *)&pRVar2->msg);
      return;
    }
  }
  return;
}

Assistant:

void Device::setThreadErrorCode(RTCError error, std::string const& msg)
  {
    RTCErrorMessage* stored_error = g_errorHandler.error();
    if (stored_error->error == RTC_ERROR_NONE) {
      stored_error->error = error;
      if (msg != "")
        stored_error->msg = msg;
    }
  }